

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verify.cpp
# Opt level: O3

TestReturnValue __thiscall
embree::NewDeleteGeometryTest::run(NewDeleteGeometryTest *this,VerifyApplication *state,bool silent)

{
  size_type *psVar1;
  RandomSampler *pRVar2;
  float *pfVar3;
  pointer pcVar4;
  RTCError code;
  uint uVar5;
  TestReturnValue TVar6;
  undefined8 *puVar7;
  RTCDevice userPtr;
  long lVar8;
  ulong uVar9;
  int sse2;
  size_t i;
  uint uVar10;
  ulong uVar11;
  float fVar12;
  RTCDeviceRef device;
  Vec3fa pos;
  string cfg;
  VerifyScene scene;
  uint geom [128];
  Sphere spheres [128];
  
  pfVar3 = &spheres[0].r;
  pcVar4 = (state->super_Application).rtcore._M_dataplus._M_p;
  spheres[0].pos.field_0._0_8_ = pfVar3;
  std::__cxx11::string::_M_construct<char*>
            ((string *)spheres,pcVar4,pcVar4 + (state->super_Application).rtcore._M_string_length);
  std::__cxx11::string::append((char *)spheres);
  stringOfISA_abi_cxx11_((string *)geom,(embree *)(ulong)(uint)(this->super_Test).sse2,sse2);
  uVar11 = 0xf;
  if ((float *)spheres[0].pos.field_0._0_8_ != pfVar3) {
    uVar11 = spheres[0]._16_8_;
  }
  if (uVar11 < (ulong)(geom._8_8_ + spheres[0].pos.field_0._8_8_)) {
    uVar11 = 0xf;
    if ((uint *)geom._0_8_ != geom + 4) {
      uVar11 = geom._16_8_;
    }
    if ((ulong)(geom._8_8_ + spheres[0].pos.field_0._8_8_) <= uVar11) {
      puVar7 = (undefined8 *)
               std::__cxx11::string::replace((ulong)geom,0,(char *)0x0,spheres[0].pos.field_0._0_8_)
      ;
      goto LAB_0014241d;
    }
  }
  puVar7 = (undefined8 *)std::__cxx11::string::_M_append((char *)spheres,geom._0_8_);
LAB_0014241d:
  cfg._M_dataplus._M_p = (pointer)&cfg.field_2;
  psVar1 = puVar7 + 2;
  if ((size_type *)*puVar7 == psVar1) {
    cfg.field_2._M_allocated_capacity = *psVar1;
    cfg.field_2._8_8_ = puVar7[3];
  }
  else {
    cfg.field_2._M_allocated_capacity = *psVar1;
    cfg._M_dataplus._M_p = (pointer)*puVar7;
  }
  cfg._M_string_length = puVar7[1];
  *puVar7 = psVar1;
  puVar7[1] = 0;
  *(char *)psVar1 = '\0';
  if ((uint *)geom._0_8_ != geom + 4) {
    operator_delete((void *)geom._0_8_);
  }
  if ((float *)spheres[0].pos.field_0._0_8_ != pfVar3) {
    operator_delete((void *)spheres[0].pos.field_0._0_8_);
  }
  userPtr = (RTCDevice)rtcNewDevice(cfg._M_dataplus._M_p);
  device.device = userPtr;
  code = rtcGetDeviceError();
  errorHandler(userPtr,code,(char *)0x0);
  VerifyScene::VerifyScene(&scene,&device,this->sflags);
  AssertNoError(device.device);
  memset(geom,0xff,0x200);
  lVar8 = 0;
  do {
    *(undefined8 *)((long)&spheres[0].pos.field_0 + lVar8) = 0;
    *(undefined8 *)((long)&spheres[0].pos.field_0 + lVar8 + 8) = 0;
    *(undefined4 *)((long)&spheres[0].r + lVar8) = 0;
    lVar8 = lVar8 + 0x20;
  } while (lVar8 != 0x1000);
  memset(spheres,0,0x1000);
  fVar12 = state->intensity * 50.0;
  lVar8 = (long)fVar12;
  if (((long)(fVar12 - 9.223372e+18) & lVar8 >> 0x3f) != 0 || lVar8 != 0) {
    pRVar2 = &(this->super_Test).sampler;
    uVar11 = 0;
    do {
      lVar8 = 10;
      do {
        uVar10 = pRVar2->s * 0x19660d + 0x3c6ef35f >> 1 & 0x7f;
        uVar5 = pRVar2->s * 0x979e791 + 0xaaf95334;
        pRVar2->s = uVar5;
        if (geom[uVar10] == 0xffffffff) {
          uVar5 = uVar5 * 0x19660d + 0x3c6ef35f;
          pRVar2->s = uVar5;
          uVar5 = uVar5 >> 1;
          TVar6 = (*(code *)(&DAT_0021a2d4 +
                            *(int *)(&DAT_0021a2d4 +
                                    (ulong)(uVar5 - (uVar5 / 0xb + (uVar5 / 0xb) * 10)) * 4)))();
          return TVar6;
        }
        rtcDetachGeometry(scene.scene.scene);
        AssertNoError(device.device);
        geom[uVar10] = 0xffffffff;
        lVar8 = lVar8 + -1;
      } while (lVar8 != 0);
      rtcCommitScene(scene.scene.scene);
      AssertNoError(device.device);
      rtcCommitScene(scene.scene.scene);
      AssertNoError(device.device);
      if ((uVar11 & 1) == 0) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,".",1);
        std::ostream::flush();
      }
      uVar11 = uVar11 + 1;
      fVar12 = state->intensity * 50.0;
      uVar9 = (ulong)fVar12;
    } while (uVar11 < ((long)(fVar12 - 9.223372e+18) & (long)uVar9 >> 0x3f | uVar9));
  }
  lVar8 = 0;
  do {
    if (geom[lVar8] != 0xffffffff) {
      rtcDetachGeometry(scene.scene.scene);
    }
    lVar8 = lVar8 + 1;
  } while (lVar8 != 0x80);
  rtcCommitScene(scene.scene.scene);
  AssertNoError(device.device);
  rtcCommitScene(scene.scene.scene);
  AssertNoError(device.device);
  scene.super_RefCount._vptr_RefCount = (_func_int **)&PTR__VerifyScene_002675e0;
  std::
  vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
  ::~vector(&scene.nodes);
  rtcReleaseScene(scene.scene.scene);
  RTCDeviceRef::~RTCDeviceRef(&device);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)cfg._M_dataplus._M_p != &cfg.field_2) {
    operator_delete(cfg._M_dataplus._M_p);
  }
  return PASSED;
}

Assistant:

VerifyApplication::TestReturnValue run(VerifyApplication* state, bool silent)
    {
      std::string cfg = state->rtcore + ",isa="+stringOfISA(isa);
      RTCDeviceRef device = rtcNewDevice(cfg.c_str());
      errorHandler(nullptr,rtcGetDeviceError(device));
      VerifyScene scene(device,sflags);
      AssertNoError(device);
      unsigned int geom[128];
      for (size_t i=0; i<128; i++) geom[i] = -1;
      Sphere spheres[128];
      memset(spheres,0,sizeof(spheres));
      
      for (size_t i=0; i<size_t(50*state->intensity); i++) 
      {
        for (size_t j=0; j<10; j++) {
          int index = random_int()%128;
          Vec3fa pos = 100.0f*random_Vec3fa();
          if (geom[index] == -1) {
            switch (random_int()%11) {
            case 0: geom[index] = scene.addSphere(sampler,RTC_BUILD_QUALITY_MEDIUM,pos,2.0f,10).first; break;
            case 1: geom[index] = scene.addSphere(sampler,RTC_BUILD_QUALITY_MEDIUM,pos,2.0f,10,-1,random_motion_vector(1.0f)).first; break;
            case 2: geom[index] = scene.addQuadSphere(sampler,RTC_BUILD_QUALITY_MEDIUM,pos,2.0f,10).first; break;
            case 3: geom[index] = scene.addQuadSphere(sampler,RTC_BUILD_QUALITY_MEDIUM,pos,2.0f,10,-1,random_motion_vector(1.0f)).first; break;
            case 4: geom[index] = scene.addGridSphere(sampler,RTC_BUILD_QUALITY_MEDIUM,pos,2.0f,10).first; break;
            case 5: geom[index] = scene.addGridSphere(sampler,RTC_BUILD_QUALITY_MEDIUM,pos,2.0f,10,-1,random_motion_vector(1.0f)).first; break;
            case 6: geom[index] = scene.addHair(sampler,RTC_BUILD_QUALITY_MEDIUM,pos,1.0f,2.0f,10).first; break;
            case 7: geom[index] = scene.addHair(sampler,RTC_BUILD_QUALITY_MEDIUM,pos,1.0f,2.0f,10,random_motion_vector(1.0f)).first; break;
            case 8: geom[index] = scene.addSubdivSphere(sampler,RTC_BUILD_QUALITY_MEDIUM,pos,2.0f,4,4).first; break;
            case 9: geom[index] = scene.addSubdivSphere(sampler,RTC_BUILD_QUALITY_MEDIUM,pos,2.0f,4,4,-1,random_motion_vector(1.0f)).first; break;
            case 10: 
              spheres[index] = Sphere(pos,2.0f);
              geom[index] = scene.addUserGeometryEmpty(sampler,RTC_BUILD_QUALITY_MEDIUM,&spheres[index]).first; break;
            }
            AssertNoError(device);
          }
          else { 
            rtcDetachGeometry(scene,geom[index]);     
            AssertNoError(device);
            geom[index] = -1; 
          }
        }
        rtcCommitScene(scene);
        AssertNoError(device);
        rtcCommitScene(scene);
        AssertNoError(device);
        if (i%2 == 0) std::cout << "." << std::flush;
      }
      
      /* now delete all geometries */
      for (size_t i=0; i<128; i++) 
        if (geom[i] != -1) rtcDetachGeometry(scene,geom[i]);
      rtcCommitScene(scene);
      AssertNoError(device);

      rtcCommitScene (scene);
      AssertNoError(device);

      return VerifyApplication::PASSED;
    }